

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factorgraph.cpp
# Opt level: O2

VarSet * __thiscall
libDAI::FactorGraph::Delta(VarSet *__return_storage_ptr__,FactorGraph *this,VarSet *ns)

{
  pointer pVVar1;
  VarSet VStack_48;
  
  (__return_storage_ptr__->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __return_storage_ptr__->_statespace = 1;
  for (pVVar1 = (ns->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                super__Vector_impl_data._M_start;
      pVVar1 != (ns->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                super__Vector_impl_data._M_finish; pVVar1 = pVVar1 + 1) {
    (*(this->super_GraphicalModel)._vptr_GraphicalModel[0xd])(&VStack_48,this,pVVar1);
    VarSet::operator|=(__return_storage_ptr__,&VStack_48);
    std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
              ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&VStack_48);
  }
  return __return_storage_ptr__;
}

Assistant:

VarSet FactorGraph::Delta( const VarSet &ns ) const {
        VarSet result;
        for( VarSet::const_iterator n = ns.begin(); n != ns.end(); n++ ) 
            result |= Delta(*n);
        return result;
    }